

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_png_file(char *filename,int width,int height,uchar *pixels,Color *palette)

{
  uint code;
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  allocator local_289;
  vector<unsigned_char,_std::allocator<unsigned_char>_> png;
  string local_260;
  State state;
  
  png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lodepng::State::State(&state);
  state.super_LodePNGState.info_raw.colortype = LCT_PALETTE;
  state.super_LodePNGState.info_raw.bitdepth = 8;
  for (lVar3 = 2; lVar3 != 0x32; lVar3 = lVar3 + 3) {
    lodepng_palette_add(&state.super_LodePNGState.info_raw,*(uchar *)((long)palette + lVar3 + -2),
                        *(uchar *)((long)palette + lVar3 + -1),(&palette->red)[lVar3],0xff);
  }
  code = lodepng::encode(&png,pixels,width,height,&state);
  if (code == 0) {
    std::__cxx11::string::string((string *)&local_260,filename,&local_289);
    lodepng::save_file(&png,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"[write_png_file] encoder error ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,": ");
    pcVar2 = lodepng_error_text(code);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  lodepng::State::~State(&state);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void write_png_file(const char *filename, int width, int height, const unsigned char *pixels, Color *palette) {
    std::vector<unsigned char> png;
    lodepng::State state;
    state.info_raw.colortype = LCT_PALETTE;
    state.info_raw.bitdepth = 8;

    for (int i = 0; i < MAX_COLOURS; i++) {
        lodepng_palette_add(
                &state.info_raw,
                palette[i].red,
                palette[i].green,
                palette[i].blue,
                0xFF
        );
    }
    unsigned error = lodepng::encode(png, pixels, (unsigned )width, (unsigned )height, state);
    if(!error) lodepng::save_file(png, filename);
    if (error) {
        std::cout << "[write_png_file] encoder error " << error << ": "<< lodepng_error_text(error) << std::endl;
    }
}